

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi *B;
  mbedtls_mpi *X_00;
  mbedtls_mpi TU;
  mbedtls_mpi Y;
  mbedtls_mpi V1;
  mbedtls_mpi TV;
  mbedtls_mpi U2;
  mbedtls_mpi U1;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi TA;
  mbedtls_mpi V2;
  mbedtls_mpi TB;
  mbedtls_mpi G;
  mbedtls_mpi local_128;
  mbedtls_mpi local_110;
  mbedtls_mpi local_f8;
  mbedtls_mpi local_e0;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b0;
  undefined1 local_98 [16];
  mbedtls_mpi_uint *local_88;
  undefined8 uStack_80;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  local_110.p = (mbedtls_mpi_uint *)&local_48;
  local_48.s = 0;
  local_48._4_4_ = 0;
  local_110.s = 1;
  local_110.n = 1;
  iVar1 = mbedtls_mpi_cmp_mpi(N,&local_110);
  if (iVar1 < 1) {
    return -4;
  }
  local_98._8_4_ = 1;
  local_88 = (mbedtls_mpi_uint *)0x0;
  uStack_80 = 0;
  local_128.s = 1;
  local_128.n = 0;
  local_128.p = (mbedtls_mpi_uint *)0x0;
  local_b0.s = 1;
  local_b0.n = 0;
  local_b0.p = (mbedtls_mpi_uint *)0x0;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_60.s = 1;
  local_60.n = 0;
  local_60.p = (mbedtls_mpi_uint *)0x0;
  local_e0.s = 1;
  local_e0.n = 0;
  local_e0.p = (mbedtls_mpi_uint *)0x0;
  local_f8.s = 1;
  local_f8.n = 0;
  local_f8.p = (mbedtls_mpi_uint *)0x0;
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  iVar1 = mbedtls_mpi_gcd(&local_48,A,N);
  if (iVar1 == 0) {
    local_98._0_8_ = 1;
    local_110.s = 1;
    local_110.n = 1;
    local_110.p = (mbedtls_mpi_uint *)local_98;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&local_110);
    iVar1 = -0xe;
    if ((((((iVar2 == 0) &&
           (iVar1 = mbedtls_mpi_mod_mpi((mbedtls_mpi *)(local_98 + 8),A,N), iVar1 == 0)) &&
          (iVar1 = mbedtls_mpi_copy(&local_128,(mbedtls_mpi *)(local_98 + 8)), iVar1 == 0)) &&
         ((iVar1 = mbedtls_mpi_copy(&local_60,N), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_copy(&local_e0,N), iVar1 == 0)))) &&
        ((iVar1 = mbedtls_mpi_lset(&local_b0,1), iVar1 == 0 &&
         ((iVar1 = mbedtls_mpi_lset(&local_c8,0), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_lset(&local_f8,0), iVar1 == 0)))))) &&
       (iVar1 = mbedtls_mpi_lset(&local_78,1), iVar1 == 0)) {
      do {
        while ((*local_128.p & 1) == 0) {
          iVar1 = mbedtls_mpi_shift_r(&local_128,1);
          if (((iVar1 != 0) ||
              ((((*local_b0.p & 1) != 0 || ((*local_c8.p & 1) != 0)) &&
               ((iVar1 = mbedtls_mpi_add_mpi(&local_b0,&local_b0,&local_60), iVar1 != 0 ||
                (iVar1 = mbedtls_mpi_sub_mpi(&local_c8,&local_c8,(mbedtls_mpi *)(local_98 + 8)),
                iVar1 != 0)))))) ||
             ((iVar1 = mbedtls_mpi_shift_r(&local_b0,1), iVar1 != 0 ||
              (iVar1 = mbedtls_mpi_shift_r(&local_c8,1), iVar1 != 0)))) goto LAB_0014cb97;
        }
        while ((*local_e0.p & 1) == 0) {
          iVar1 = mbedtls_mpi_shift_r(&local_e0,1);
          if ((iVar1 != 0) ||
             (((((*local_f8.p & 1) != 0 || ((*local_78.p & 1) != 0)) &&
               ((iVar1 = mbedtls_mpi_add_mpi(&local_f8,&local_f8,&local_60), iVar1 != 0 ||
                (iVar1 = mbedtls_mpi_sub_mpi(&local_78,&local_78,(mbedtls_mpi *)(local_98 + 8)),
                iVar1 != 0)))) ||
              ((iVar1 = mbedtls_mpi_shift_r(&local_f8,1), iVar1 != 0 ||
               (iVar1 = mbedtls_mpi_shift_r(&local_78,1), iVar1 != 0)))))) goto LAB_0014cb97;
        }
        iVar1 = mbedtls_mpi_cmp_mpi(&local_128,&local_e0);
        if (iVar1 < 0) {
          iVar1 = mbedtls_mpi_sub_mpi(&local_e0,&local_e0,&local_128);
          if ((iVar1 != 0) ||
             (iVar1 = mbedtls_mpi_sub_mpi(&local_f8,&local_f8,&local_b0), iVar1 != 0)) break;
          B = &local_c8;
          X_00 = &local_78;
        }
        else {
          iVar1 = mbedtls_mpi_sub_mpi(&local_128,&local_128,&local_e0);
          if ((iVar1 != 0) ||
             (iVar1 = mbedtls_mpi_sub_mpi(&local_b0,&local_b0,&local_f8), iVar1 != 0)) break;
          B = &local_78;
          X_00 = &local_c8;
        }
        iVar1 = mbedtls_mpi_sub_mpi(X_00,X_00,B);
        if (iVar1 != 0) break;
        local_98._0_8_ = 0;
        local_110.s = 1;
        local_110.n = 1;
        local_110.p = (mbedtls_mpi_uint *)local_98;
        iVar1 = mbedtls_mpi_cmp_mpi(&local_128,&local_110);
        if (iVar1 == 0) {
          goto LAB_0014cef8;
        }
      } while( true );
    }
  }
  goto LAB_0014cb97;
  while (iVar1 = mbedtls_mpi_add_mpi(&local_f8,&local_f8,N), iVar1 == 0) {
LAB_0014cef8:
    local_98._0_8_ = 0;
    local_110.s = 1;
    local_110.n = 1;
    local_110.p = (mbedtls_mpi_uint *)local_98;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_f8,&local_110);
    if (-1 < iVar1) {
      goto LAB_0014cf47;
    }
  }
  goto LAB_0014cb97;
  while (iVar1 = mbedtls_mpi_sub_mpi(&local_f8,&local_f8,N), iVar1 == 0) {
LAB_0014cf47:
    iVar1 = mbedtls_mpi_cmp_mpi(&local_f8,N);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_copy(X,&local_f8);
      break;
    }
  }
LAB_0014cb97:
  mbedtls_mpi_free((mbedtls_mpi *)(local_98 + 8));
  mbedtls_mpi_free(&local_128);
  mbedtls_mpi_free(&local_b0);
  mbedtls_mpi_free(&local_c8);
  mbedtls_mpi_free(&local_48);
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_e0);
  mbedtls_mpi_free(&local_f8);
  mbedtls_mpi_free(&local_78);
  return iVar1;
}

Assistant:

int mbedtls_mpi_inv_mod( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N )
{
    int ret;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;

    if( mbedtls_mpi_cmp_int( N, 0 ) <= 0 )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TU ); mbedtls_mpi_init( &U1 ); mbedtls_mpi_init( &U2 );
    mbedtls_mpi_init( &G ); mbedtls_mpi_init( &TB ); mbedtls_mpi_init( &TV );
    mbedtls_mpi_init( &V1 ); mbedtls_mpi_init( &V2 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &G, A, N ) );

    if( mbedtls_mpi_cmp_int( &G, 1 ) != 0 )
    {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &TA, A, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TU, &TA ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TV, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U1, 1 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &U2, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V1, 0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &V2, 1 ) );

    do
    {
        while( ( TU.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TU, 1 ) );

            if( ( U1.p[0] & 1 ) != 0 || ( U2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &U1, &U1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &U2, 1 ) );
        }

        while( ( TV.p[0] & 1 ) == 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TV, 1 ) );

            if( ( V1.p[0] & 1 ) != 0 || ( V2.p[0] & 1 ) != 0 )
            {
                MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, &TB ) );
                MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &TA ) );
            }

            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V1, 1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &V2, 1 ) );
        }

        if( mbedtls_mpi_cmp_mpi( &TU, &TV ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TU, &TU, &TV ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U1, &U1, &V1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &U2, &U2, &V2 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &TV, &TV, &TU ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, &U1 ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V2, &V2, &U2 ) );
        }
    }
    while( mbedtls_mpi_cmp_int( &TU, 0 ) != 0 );

    while( mbedtls_mpi_cmp_int( &V1, 0 ) < 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &V1, &V1, N ) );

    while( mbedtls_mpi_cmp_mpi( &V1, N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &V1, &V1, N ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, &V1 ) );

cleanup:

    mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TU ); mbedtls_mpi_free( &U1 ); mbedtls_mpi_free( &U2 );
    mbedtls_mpi_free( &G ); mbedtls_mpi_free( &TB ); mbedtls_mpi_free( &TV );
    mbedtls_mpi_free( &V1 ); mbedtls_mpi_free( &V2 );

    return( ret );
}